

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

void __thiscall chrono::ChBody::RemoveAllForces(ChBody *this)

{
  pointer psVar1;
  pointer psVar2;
  
  psVar1 = (this->forcelist).
           super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->forcelist).
                super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    ((psVar2->super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->Body =
         (ChBody *)0x0;
  }
  std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ::clear(&this->forcelist);
  return;
}

Assistant:

void ChBody::RemoveAllForces() {
    for (auto& force : forcelist) {
        force->SetBody(NULL);
    }
    forcelist.clear();
}